

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sljitNativeX86_64.c
# Opt level: O1

sljit_s32 sljit_emit_icall(sljit_compiler *compiler,sljit_s32 type,sljit_s32 arg_types,sljit_s32 src
                          ,sljit_sw srcw)

{
  bool bVar1;
  sljit_s32 in_EAX;
  uint uVar2;
  sljit_s32 sVar3;
  sljit_u8 *psVar4;
  ulong uVar5;
  undefined4 in_register_00000014;
  
  if (compiler->error != 0) {
    return in_EAX;
  }
  compiler->mode32 = 0;
  uVar2 = 0;
  if (0xf < (uint)type) {
    uVar2 = 0;
    uVar5 = (ulong)(uint)type;
    do {
      uVar5 = uVar5 >> 4;
      uVar2 = uVar2 + ((type & 0xf0U) < 0x50);
      bVar1 = 0xff < (uint)type;
      type = (uint)uVar5;
    } while (bVar1);
  }
  if (uVar2 != 0) {
    if (2 < uVar2) {
      psVar4 = emit_x86_instruction(compiler,1,3,0,0xf,0);
      if (psVar4 == (sljit_u8 *)0x0) {
        if (compiler->error != 0) {
          return 0;
        }
      }
      else {
        *psVar4 = 0x89;
      }
    }
    psVar4 = emit_x86_instruction(compiler,1,1,0,3,0);
    if (psVar4 == (sljit_u8 *)0x0) {
      if (compiler->error != 0) {
        return 0;
      }
    }
    else {
      *psVar4 = 0x89;
    }
  }
  sVar3 = sljit_emit_ijump(compiler,0x1a,0x40,CONCAT44(in_register_00000014,arg_types));
  return sVar3;
}

Assistant:

SLJIT_API_FUNC_ATTRIBUTE sljit_s32 sljit_emit_icall(struct sljit_compiler *compiler, sljit_s32 type,
	sljit_s32 arg_types,
	sljit_s32 src, sljit_sw srcw)
{
	CHECK_ERROR();
	CHECK(check_sljit_emit_icall(compiler, type, arg_types, src, srcw));

	FAIL_IF(call_with_args(compiler, arg_types, &src, srcw));

#if (defined SLJIT_VERBOSE && SLJIT_VERBOSE) \
		|| (defined SLJIT_ARGUMENT_CHECKS && SLJIT_ARGUMENT_CHECKS)
	compiler->skip_checks = 1;
#endif

	return sljit_emit_ijump(compiler, type, src, srcw);
}